

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O2

int lua_setmetatable(lua_State *L,int objindex)

{
  int iVar1;
  TValue *pTVar2;
  GCObject *v;
  
  if (L->top == L->base || (long)L->top - (long)L->base < 0) {
    __assert_fail("(1) <= (L->top - L->base)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cuberite[P]lua/src/lapi.cpp"
                  ,0x2bd,"int lua_setmetatable(lua_State *, int)");
  }
  pTVar2 = index2adr(L,objindex);
  if (pTVar2 != &luaO_nilobject_) {
    iVar1 = L->top[-1].tt;
    if (iVar1 == 0) {
      v = (GCObject *)0x0;
    }
    else {
      if (iVar1 != 5) {
        __assert_fail("(((L->top - 1)->tt) == 5)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cuberite[P]lua/src/lapi.cpp"
                      ,0x2c3,"int lua_setmetatable(lua_State *, int)");
      }
      v = L->top[-1].value.gc;
    }
    iVar1 = pTVar2->tt;
    if ((long)iVar1 == 7) {
      (((pTVar2->value).gc)->h).metatable = (Table *)v;
      if (((v != (GCObject *)0x0) && (((v->gch).marked & 3) != 0)) &&
         (((((pTVar2->value).gc)->gch).marked & 4) != 0)) {
        luaC_barrierf(L,(pTVar2->value).gc,v);
      }
    }
    else if (iVar1 == 5) {
      (((pTVar2->value).gc)->h).metatable = (Table *)v;
      if (((v != (GCObject *)0x0) && (((v->gch).marked & 3) != 0)) &&
         (((((pTVar2->value).gc)->gch).marked & 4) != 0)) {
        luaC_barrierback(L,&((pTVar2->value).gc)->h);
      }
    }
    else {
      L->l_G->mt[iVar1] = (Table *)v;
    }
    L->top = L->top + -1;
    return 1;
  }
  __assert_fail("(obj) != (&luaO_nilobject_)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cuberite[P]lua/src/lapi.cpp"
                ,0x2bf,"int lua_setmetatable(lua_State *, int)");
}

Assistant:

LUA_API int lua_setmetatable (lua_State *L, int objindex) {
  TValue *obj;
  Table *mt;
  lua_lock(L);
  api_checknelems(L, 1);
  obj = index2adr(L, objindex);
  api_checkvalidindex(L, obj);
  if (ttisnil(L->top - 1))
    mt = NULL;
  else {
    api_check(L, ttistable(L->top - 1));
    mt = hvalue(L->top - 1);
  }
  switch (ttype(obj)) {
    case LUA_TTABLE: {
      hvalue(obj)->metatable = mt;
      if (mt)
        luaC_objbarriert(L, hvalue(obj), mt);
      break;
    }
    case LUA_TUSERDATA: {
      uvalue(obj)->metatable = mt;
      if (mt)
        luaC_objbarrier(L, rawuvalue(obj), mt);
      break;
    }
    default: {
      G(L)->mt[ttype(obj)] = mt;
      break;
    }
  }
  L->top--;
  lua_unlock(L);
  return 1;
}